

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

bool __thiscall FIX::SessionState::withinHeartBeat(SessionState *this,UtcTimeStamp *now)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = operator-(&now->super_DateTime,&(this->m_lastSentTime).super_DateTime);
  iVar3 = IntField::getValue(&(this->m_heartBtInt).super_IntField);
  if (iVar2 < iVar3) {
    iVar2 = operator-(&now->super_DateTime,&(this->m_lastReceivedTime).super_DateTime);
    iVar3 = IntField::getValue(&(this->m_heartBtInt).super_IntField);
    bVar1 = iVar2 < iVar3;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool withinHeartBeat(const UtcTimeStamp &now) const {
    return ((now - lastSentTime()) < heartBtInt()) && ((now - lastReceivedTime()) < heartBtInt());
  }